

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * google::protobuf::anon_unknown_24::ValueOutOfRange<int>
                   (string_view type_name,string_view option_name)

{
  string *in_RDI;
  size_type in_R9;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  UntypedFormatSpecImpl format;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  code *local_30;
  undefined1 *local_28;
  code *local_20;
  undefined1 *local_18;
  code *local_10;
  
  local_18 = local_68;
  local_28 = local_58;
  local_48 = 0x80000000;
  local_40 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
  local_38 = 0x7fffffff;
  local_30 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
  local_20 = absl::lts_20250127::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  local_10 = absl::lts_20250127::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  args.len_ = in_R9;
  args.ptr_ = (pointer)&DAT_00000004;
  format.size_ = (size_t)&local_48;
  format.data_ = &DAT_00000031;
  absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
            (in_RDI,(str_format_internal *)"Value out of range, %d to %d, for %s option \"%s\".",
             format,args);
  return in_RDI;
}

Assistant:

std::string ValueOutOfRange(absl::string_view type_name,
                            absl::string_view option_name) {
  return absl::StrFormat("Value out of range, %d to %d, for %s option \"%s\".",
                         std::numeric_limits<T>::min(),
                         std::numeric_limits<T>::max(), type_name, option_name);
}